

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

int lest::run<3ul>(test (*specification) [3],ostream *os)

{
  int iVar1;
  allocator_type local_69;
  texts local_68;
  vector<lest::test,_std::allocator<lest::test>_> local_48;
  tests local_28;
  
  std::vector<lest::test,std::allocator<lest::test>>::vector<lest::test_const*,void>
            ((vector<lest::test,std::allocator<lest::test>> *)&local_48,*specification,
             specification[1],&local_69);
  local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = run(&local_28,&local_68,os);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_28);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_48);
  return iVar1;
}

Assistant:

int run( test const (&specification)[N], std::ostream & os = std::cout )
{
    return run( tests( specification, specification + N ), {}, os  );
}